

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O1

void __thiscall QNetworkReplyImplPrivate::finished(QNetworkReplyImplPrivate *this)

{
  QNetworkReply *this_00;
  pointer pIVar1;
  _Storage<long_long,_true> _t2;
  _Storage<long_long,_true> _Var2;
  long in_FS_OFFSET;
  QByteArrayView value;
  QByteArrayView QVar3;
  optional<long_long> oVar4;
  pair<QByteArray,_QByteArray> *local_30;
  
  local_30 = *(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28);
  if (1 < this->state - Finished) {
    this_00 = *(QNetworkReply **)&(this->super_QNetworkReplyPrivate).field_0x8;
    this->notificationHandlingPaused = true;
    QNetworkHeadersPrivate::headers((QNetworkHeadersPrivate *)&stack0xffffffffffffffc8);
    QVar3 = QHttpHeaders::value((QHttpHeaders *)&stack0xffffffffffffffc8,ContentLength,
                                (QByteArrayView)ZEXT816(0));
    value.m_data = QVar3.m_data;
    value.m_size = (qsizetype)value.m_data;
    oVar4 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar3.m_size,value);
    QHttpHeaders::~QHttpHeaders((QHttpHeaders *)&stack0xffffffffffffffc8);
    _Var2._M_value = -1;
    if (((undefined1  [16])
         oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
         super__Optional_payload_base<long_long> & (undefined1  [16])0x1) != (undefined1  [16])0x0)
    {
      _Var2._M_value =
           oVar4.super__Optional_base<long_long,_true,_true>._M_payload.
           super__Optional_payload_base<long_long>._M_payload;
    }
    resumeNotificationHandling(this);
    this->state = Finished;
    QNetworkReply::setFinished(this_00,true);
    pIVar1 = (this->pendingNotifications).
             super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->pendingNotifications).
        super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
        ._M_impl.super__Vector_impl_data._M_finish != pIVar1) {
      (this->pendingNotifications).
      super__Vector_base<QNetworkReplyImplPrivate::InternalNotifications,_std::allocator<QNetworkReplyImplPrivate::InternalNotifications>_>
      ._M_impl.super__Vector_impl_data._M_finish = pIVar1;
    }
    this->notificationHandlingPaused = true;
    _t2 = _Var2;
    if (_Var2._M_value == -1) {
      _t2 = (_Storage<long_long,_true>)this->bytesDownloaded;
    }
    QNetworkReply::downloadProgress(this_00,this->bytesDownloaded,_t2._M_value);
    if ((this->bytesUploaded == -1) &&
       ((this->outgoingDataBuffer).super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0 || this->outgoingData != (QIODevice *)0x0)) {
      QNetworkReply::uploadProgress(this_00,0,0);
    }
    resumeNotificationHandling(this);
    if ((_Var2._M_value == -1) || (this->bytesDownloaded == _Var2._M_value)) {
      completeCacheSave(this);
    }
    this->notificationHandlingPaused = true;
    QIODevice::readChannelFinished();
    QNetworkReply::finished(this_00);
    resumeNotificationHandling(this);
  }
  if (*(pair<QByteArray,_QByteArray> **)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyImplPrivate::finished()
{
    Q_Q(QNetworkReplyImpl);

    if (state == Finished || state == Aborted)
        return;

    pauseNotificationHandling();
    const auto totalSizeOpt = QNetworkHeadersPrivate::toInt(
            headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
    const auto totalSize = totalSizeOpt.value_or(-1);

    resumeNotificationHandling();

    state = Finished;
    q->setFinished(true);

    pendingNotifications.clear();

    pauseNotificationHandling();
    if (totalSize == -1) {
        emit q->downloadProgress(bytesDownloaded, bytesDownloaded);
    } else {
        emit q->downloadProgress(bytesDownloaded, totalSize);
    }

    if (bytesUploaded == -1 && (outgoingData || outgoingDataBuffer))
        emit q->uploadProgress(0, 0);
    resumeNotificationHandling();

    // if we don't know the total size of or we received everything save the cache
    if (totalSize == -1 || bytesDownloaded == totalSize)
        completeCacheSave();

    // note: might not be a good idea, since users could decide to delete us
    // which would delete the backend too...
    // maybe we should protect the backend
    pauseNotificationHandling();
    emit q->readChannelFinished();
    emit q->finished();
    resumeNotificationHandling();
}